

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O0

void Commands::Unjail(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  short sVar1;
  Character *from_00;
  int iVar2;
  undefined4 extraout_var;
  const_reference pvVar3;
  Character *pCVar4;
  undefined4 extraout_var_00;
  mapped_type *this;
  undefined4 extraout_var_01;
  bool bVar5;
  anon_class_1_0_00000001 local_e1;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  byte local_73;
  byte local_72;
  allocator<char> local_71;
  key_type local_70;
  string local_40;
  Character *local_20;
  Character *victim;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  victim = (Character *)from;
  from_local = (Command_Source *)arguments;
  iVar2 = (*from->_vptr_Command_Source[4])();
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)from_local,0);
  std::__cxx11::string::string((string *)&local_40,(string *)pvVar3);
  pCVar4 = World::GetCharacter((World *)CONCAT44(extraout_var,iVar2),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_72 = 0;
  local_73 = 0;
  bVar5 = false;
  local_20 = pCVar4;
  if (pCVar4 != (Character *)0x0) {
    sVar1 = pCVar4->mapid;
    iVar2 = (*(victim->super_Command_Source)._vptr_Command_Source[4])();
    std::allocator<char>::allocator();
    local_72 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"JailMap",&local_71);
    local_73 = 1;
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)(CONCAT44(extraout_var_00,iVar2) + 0x198),&local_70);
    iVar2 = util::variant::operator_cast_to_int(this);
    bVar5 = sVar1 != iVar2;
  }
  if ((local_73 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_72 & 1) != 0) {
    std::allocator<char>::~allocator(&local_71);
  }
  from_00 = victim;
  pCVar4 = local_20;
  if (bVar5) {
    iVar2 = (*(victim->super_Command_Source)._vptr_Command_Source[4])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"command_access_denied",&local_b9);
    I18N::Format<>(&local_98,(I18N *)(CONCAT44(extraout_var_01,iVar2) + 0x490),&local_b8);
    (*(from_00->super_Command_Source)._vptr_Command_Source[5])(from_00,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  else {
    std::function<void(World*,Command_Source*,Character*,bool)>::
    function<Commands::Unjail(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*)::__0,void>
              ((function<void(World*,Command_Source*,Character*,bool)> *)&local_e0,&local_e1);
    do_punishment(&from_00->super_Command_Source,pCVar4,&local_e0,false);
    std::function<void_(World_*,_Command_Source_*,_Character_*,_bool)>::~function(&local_e0);
  }
  return;
}

Assistant:

void Unjail(const std::vector<std::string>& arguments, Command_Source* from)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);

	if (victim && victim->mapid != static_cast<int>(from->SourceWorld()->config["JailMap"]))
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
		return;
	}

	do_punishment(from, victim, [](World* world, Command_Source* from, Character* victim, bool announce)
		{
			(void)announce;
			world->Unjail(from, victim);
		}, false);
}